

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::TypedTimeSamples<double>::add_sample(TypedTimeSamples<double> *this,double t,double *v)

{
  pointer *ppSVar1;
  iterator __position;
  Sample s;
  Sample local_20;
  
  local_20.blocked = false;
  local_20.value = *v;
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.t = t;
    ::std::
    vector<tinyusdz::TypedTimeSamples<double>::Sample,std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<double>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<double>::Sample,std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>>
                *)this,__position,&local_20);
  }
  else {
    *(ulong *)&(__position._M_current)->blocked = (ulong)(uint7)local_20._17_7_ << 8;
    (__position._M_current)->t = t;
    (__position._M_current)->value = local_20.value;
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }